

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O3

int hex_encode(void *in_buf,uint in_size,char *out_buf,uint out_size,int lowercase)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  
  iVar2 = (int)out_buf;
  pcVar6 = "0123456789abcdef";
  if (lowercase == 0) {
    pcVar6 = "0123456789ABCDEF";
  }
  if (out_buf == (char *)0x0) {
    return in_size * 2 | 1;
  }
  iVar1 = -1;
  if (in_size * 2 <= out_size) {
    pcVar7 = out_buf + out_size;
    if (1 < out_size && in_size != 0) {
      uVar5 = (long)in_buf + 1;
      pcVar3 = out_buf;
      do {
        *pcVar3 = pcVar6[*(byte *)(uVar5 - 1) >> 4];
        out_buf = pcVar3 + 2;
        pcVar3[1] = pcVar6[*(byte *)(uVar5 - 1) & 0xf];
        if ((ulong)in_size + (long)in_buf <= uVar5) break;
        pcVar4 = pcVar3 + 3;
        uVar5 = uVar5 + 1;
        pcVar3 = out_buf;
      } while (pcVar4 < pcVar7);
    }
    if (out_buf < pcVar7) {
      *out_buf = '\0';
    }
    iVar1 = (int)out_buf - iVar2;
  }
  return iVar1;
}

Assistant:

int
hex_encode(const void* in_buf, unsigned in_size,
           char* out_buf, unsigned out_size, int lowercase)
{
    static const char lower_xdigits[16] = "0123456789abcdef";
    static const char upper_xdigits[16] = "0123456789ABCDEF";

    const char* xdigits = (lowercase ? lower_xdigits : upper_xdigits);
    const unsigned char* in;
    const unsigned char* in_end;
    char* out;
    char* out_end;

    if(out_buf == NULL)
        return in_size * 2 + 1;

    if(out_size < in_size * 2)
        return -1;

    in = (const unsigned char*) in_buf;
    in_end = in + in_size;
    out = out_buf;
    out_end = out + out_size;

    while(in < in_end  &&  out + 1 < out_end) {
        *out++ = xdigits[(*in & 0xf0) >> 4];
        *out++ = xdigits[(*in & 0x0f)];
        in++;
    }

    /* If enough space in the output buffer, append zero terminator. */
    if(out < out_end)
        *out = '\0';

    return out - out_buf;
}